

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O2

void __thiscall unittest::UnitTest::TestExtract(UnitTest *this)

{
  bool bVar1;
  int16_t i16;
  bool bool_;
  int32_t i32;
  string str;
  allocator<char> local_5d;
  short local_5c;
  bool local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"oops",(allocator<char> *)&local_58);
  local_5c = 0;
  local_34 = 0;
  local_59 = true;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_assign((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  Assert::AreEqual<std::__cxx11::string>(&local_58,&local_30);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"hello",&local_5d);
  std::__cxx11::string::_M_assign((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"hello",&local_5d);
  Assert::AreEqual<std::__cxx11::string>(&local_58,&local_30);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"hello world",&local_5d);
  std::__cxx11::string::_M_assign((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"hello world",&local_5d);
  Assert::AreEqual<std::__cxx11::string>(&local_58,&local_30);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"-10",&local_5d);
  bVar1 = inipp::extract<char,short>(&local_58,&local_5c);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p._0_2_ = 0xfff6;
  Assert::AreEqual<short>((short *)&local_58,&local_5c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"false",&local_5d);
  bVar1 = inipp::extract<char,bool>(&local_58,&local_59);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
  Assert::AreEqual<bool>((bool *)&local_58,&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"-10",&local_5d);
  bVar1 = inipp::extract<char,short>(&local_58,&local_5c);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p._0_2_ = 0xfff6;
  Assert::AreEqual<short>((short *)&local_58,&local_5c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"xxx",&local_5d);
  bVar1 = inipp::extract<char,short>(&local_58,&local_5c);
  Assert::IsFalse(bVar1);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p._0_2_ = 0xfff6;
  Assert::AreEqual<short>((short *)&local_58,&local_5c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"1000000",&local_5d);
  bVar1 = inipp::extract<char,short>(&local_58,&local_5c);
  Assert::IsFalse(bVar1);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p._0_2_ = 0xfff6;
  Assert::AreEqual<short>((short *)&local_58,&local_5c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"-20 xxx",&local_5d);
  bVar1 = inipp::extract<char,short>(&local_58,&local_5c);
  Assert::IsFalse(bVar1);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p._0_2_ = 0xfff6;
  Assert::AreEqual<short>((short *)&local_58,&local_5c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"1000000",&local_5d);
  bVar1 = inipp::extract<char,int>(&local_58,&local_34);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p._0_4_ = 1000000;
  Assert::AreEqual<int>((int *)&local_58,&local_34);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

TEST_METHOD(TestExtract)
		{
			std::string       str{ "oops" };
			int16_t           i16{ 0 };
			int32_t           i32{ 0 };
			bool              bool_{ true };
			Assert::IsTrue(extract(std::string(), str));
			Assert::AreEqual(std::string{ }, str);
			Assert::IsTrue(extract(std::string{ "hello" }, str));
			Assert::AreEqual(std::string{ "hello" }, str);
			Assert::IsTrue(extract(std::string{ "hello world" }, str));
			Assert::AreEqual(std::string{ "hello world" }, str);
			Assert::IsTrue(extract(std::string{ "-10" }, i16));
			Assert::AreEqual(int16_t{ -10 }, i16);
			Assert::IsTrue(extract(std::string{ "false" }, bool_));
			Assert::AreEqual(false, bool_);
			Assert::IsTrue(extract(std::string{ "-10" }, i16));
			Assert::AreEqual(int16_t{ -10 }, i16);
			Assert::IsFalse(extract(std::string{ "xxx" }, i16));
			Assert::AreEqual(int16_t{ -10 }, i16);
			Assert::IsFalse(extract(std::string{ "1000000" }, i16));
			Assert::AreEqual(int16_t{ -10 }, i16);
			Assert::IsFalse(extract(std::string{ "-20 xxx" }, i16));
			Assert::AreEqual(int16_t{ -10 }, i16);
			Assert::IsTrue(extract(std::string{ "1000000" }, i32));
			Assert::AreEqual(int32_t{ 1000000 }, i32);
		}